

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O1

void __thiscall CDataFileReader::ReplaceData(CDataFileReader *this,int Index,char *pData,int Size)

{
  if ((-1 < Index) && (Index < (this->m_pDataFile->m_Header).m_NumRawData)) {
    GetDataImpl(this,Index,(int)pData);
    UnloadData(this,Index);
    this->m_pDataFile->m_ppDataPtrs[(uint)Index] = pData;
    this->m_pDataFile->m_pDataSizes[(uint)Index] = Size;
  }
  return;
}

Assistant:

void CDataFileReader::ReplaceData(int Index, char *pData, int Size)
{
	if(Index < 0 || Index >= m_pDataFile->m_Header.m_NumRawData)
		return;

	// make sure the data has been loaded
	GetDataImpl(Index, 0);

	UnloadData(Index);
	m_pDataFile->m_ppDataPtrs[Index] = pData;
	m_pDataFile->m_pDataSizes[Index] = Size;
}